

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_tet_grad_nodes(REF_NODE ref_node,REF_INT *nodes,REF_DBL *scalar,REF_DBL *gradient)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  REF_DBL vol;
  REF_INT face [3];
  REF_DBL norm3 [3];
  REF_DBL norm2 [3];
  REF_DBL norm1 [3];
  double local_a8;
  double local_a0;
  REF_INT local_94;
  REF_INT local_90;
  REF_INT local_8c;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  uVar5 = ref_node_tet_vol(ref_node,nodes,&local_a8);
  if (uVar5 == 0) {
    local_a8 = local_a8 * -6.0;
    local_94 = *nodes;
    local_90 = nodes[3];
    local_8c = nodes[2];
    local_a0 = local_a8;
    uVar5 = ref_node_tri_normal(ref_node,&local_94,&local_48);
    if (uVar5 == 0) {
      local_94 = *nodes;
      local_90 = nodes[1];
      local_8c = nodes[3];
      uVar5 = ref_node_tri_normal(ref_node,&local_94,&local_68);
      if (uVar5 == 0) {
        local_94 = *nodes;
        local_90 = nodes[2];
        local_8c = nodes[1];
        uVar5 = ref_node_tri_normal(ref_node,&local_94,&local_88);
        if (uVar5 == 0) {
          iVar1 = nodes[1];
          iVar2 = *nodes;
          dVar9 = scalar[iVar2];
          iVar3 = nodes[2];
          iVar4 = nodes[3];
          dVar6 = (scalar[iVar4] - dVar9) * local_88 +
                  (scalar[iVar1] - dVar9) * local_48 + (scalar[iVar3] - dVar9) * local_68;
          *gradient = dVar6;
          dVar9 = scalar[iVar2];
          dVar7 = (scalar[iVar4] - dVar9) * local_80 +
                  (scalar[iVar1] - dVar9) * local_40 + (scalar[iVar3] - dVar9) * local_60;
          gradient[1] = dVar7;
          dVar9 = scalar[iVar2];
          dVar8 = (scalar[iVar4] - dVar9) * local_78 +
                  (scalar[iVar1] - dVar9) * local_38 + (scalar[iVar3] - dVar9) * local_58;
          gradient[2] = dVar8;
          dVar9 = local_a0 * 1e+20;
          if (dVar9 <= -dVar9) {
            dVar9 = -dVar9;
          }
          dVar10 = dVar6;
          if (dVar6 <= -dVar6) {
            dVar10 = -dVar6;
          }
          if (dVar10 < dVar9) {
            dVar10 = dVar7;
            if (dVar7 <= -dVar7) {
              dVar10 = -dVar7;
            }
            if (dVar10 < dVar9) {
              dVar10 = dVar8;
              if (dVar8 <= -dVar8) {
                dVar10 = -dVar8;
              }
              if (dVar10 < dVar9) {
                *gradient = dVar6 / local_a0;
                gradient[1] = dVar7 / local_a0;
                gradient[2] = dVar8 / local_a0;
                return 0;
              }
            }
          }
          *gradient = 0.0;
          gradient[1] = 0.0;
          gradient[2] = 0.0;
          uVar5 = 4;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xcad,"ref_node_tet_grad_nodes",(ulong)uVar5,"vol");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xca8,"ref_node_tet_grad_nodes",(ulong)uVar5,"vol");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xca3,
             "ref_node_tet_grad_nodes",(ulong)uVar5,"vol");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc9d,
           "ref_node_tet_grad_nodes",(ulong)uVar5,"vol");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_grad_nodes(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *scalar, REF_DBL *gradient) {
  REF_DBL vol, norm1[3], norm2[3], norm3[3];
  REF_INT face[3];

  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_tet_vol(ref_node, nodes, &vol), "vol");
  vol *= -6.0;

  face[0] = nodes[0];
  face[1] = nodes[3];
  face[2] = nodes[2];
  RSS(ref_node_tri_normal(ref_node, face, norm1), "vol");

  face[0] = nodes[0];
  face[1] = nodes[1];
  face[2] = nodes[3];
  RSS(ref_node_tri_normal(ref_node, face, norm2), "vol");

  face[0] = nodes[0];
  face[1] = nodes[2];
  face[2] = nodes[1];
  RSS(ref_node_tri_normal(ref_node, face, norm3), "vol");

  gradient[0] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[0] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[0] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[0];
  gradient[1] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[1] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[1] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[1];
  gradient[2] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[2] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[2] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[2];

  if (ref_math_divisible(gradient[0], vol) &&
      ref_math_divisible(gradient[1], vol) &&
      ref_math_divisible(gradient[2], vol)) {
    gradient[0] /= vol;
    gradient[1] /= vol;
    gradient[2] /= vol;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}